

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void triangle(vec2i *pts,TGAImage *image,TGAColor color)

{
  vec<2UL,_int> *this;
  size_t sVar1;
  size_t sVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  long lVar6;
  size_t j;
  ulong x;
  vec2i P;
  int iVar7;
  vec2i bboxmax;
  vec2i bboxmin;
  vec2i clamp;
  vec3f bc_screen;
  TGAColor local_80;
  vec2i *local_78;
  vec<2UL,_int> local_70;
  vec<2UL,_int> local_68;
  long local_60;
  TGAImage *local_58;
  vec<2UL,_int> local_50;
  vec3f local_48;
  
  local_80.bgra = color.bgra;
  local_80.bytespp = color.bytespp;
  local_78 = pts;
  sVar1 = TGAImage::get_width(image);
  sVar2 = TGAImage::get_height(image);
  local_68.y = (int)sVar2 + -1;
  local_70.x = 0;
  local_70.y = 0;
  local_68.x = (int)sVar1 + -1;
  sVar1 = TGAImage::get_width(image);
  local_58 = image;
  sVar2 = TGAImage::get_height(image);
  local_50.y = (int)sVar2 + -1;
  lVar6 = 0;
  local_50.x = (int)sVar1 + -1;
  while (lVar6 != 3) {
    this = local_78 + lVar6;
    local_60 = lVar6;
    for (sVar1 = 0; sVar1 != 2; sVar1 = sVar1 + 1) {
      piVar3 = vec<2UL,_int>::operator[](&local_68,sVar1);
      piVar4 = vec<2UL,_int>::operator[](this,sVar1);
      iVar7 = *piVar3;
      if (*piVar4 < *piVar3) {
        iVar7 = *piVar4;
      }
      if (iVar7 < 1) {
        iVar7 = 0;
      }
      piVar3 = vec<2UL,_int>::operator[](&local_68,sVar1);
      *piVar3 = iVar7;
      piVar3 = vec<2UL,_int>::operator[](&local_50,sVar1);
      piVar4 = vec<2UL,_int>::operator[](&local_70,sVar1);
      piVar5 = vec<2UL,_int>::operator[](this,sVar1);
      iVar7 = *piVar5;
      if (*piVar5 < *piVar4) {
        iVar7 = *piVar4;
      }
      if (*piVar3 <= iVar7) {
        iVar7 = *piVar3;
      }
      piVar3 = vec<2UL,_int>::operator[](&local_70,sVar1);
      *piVar3 = iVar7;
    }
    lVar6 = local_60 + 1;
  }
  for (x = (ulong)local_68.x; (long)x <= (long)local_70.x; x = x + 1) {
    sVar1 = (size_t)local_68.y;
    P = (vec2i)(sVar1 << 0x20 | x & 0xffffffff);
    for (; (long)sVar1 <= (long)local_70.y; sVar1 = sVar1 + 1) {
      barycentric(&local_48,local_78,P);
      if (((0.0 <= local_48.x) && (0.0 <= local_48.y)) && (0.0 <= local_48.z)) {
        TGAImage::set(local_58,x,sVar1,&local_80);
      }
      P = (vec2i)((long)P + 0x100000000);
    }
  }
  return;
}

Assistant:

void triangle(vec2i *pts, TGAImage &image, TGAColor color)
{
    vec2i bboxmin(image.get_width() - 1, image.get_height() - 1);
    vec2i bboxmax(0, 0);
    vec2i clamp(image.get_width() - 1, image.get_height() - 1);
    for (size_t i = 0; i < 3; i++) {
        for (size_t j = 0; j < 2; j++) {
            bboxmin[j] = std::max(0, std::min(bboxmin[j], pts[i][j]));
            bboxmax[j] = std::min(clamp[j], std::max(bboxmax[j], pts[i][j]));
        }
    }
    vec2i P;
    for (P.x = bboxmin.x; P.x <= bboxmax.x; P.x++) {
        for (P.y = bboxmin.y; P.y <= bboxmax.y; P.y++) {
            vec3f bc_screen = barycentric(pts, P);
            if (bc_screen.x < 0 || bc_screen.y < 0 || bc_screen.z < 0) continue;
            image.set(static_cast<int>(P.x), static_cast<int>(P.y), color);
        }
    }
}